

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void discrete_dist_test_chi2_test<trng::discrete_dist>(discrete_dist *d)

{
  int iVar1;
  size_type sVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  double *pdVar8;
  int *piVar9;
  int *piVar10;
  long lVar11;
  int iVar12;
  double dVar13;
  parameter_type P;
  vector<double,_std::allocator<double>_> p;
  vector<int,_std::allocator<int>_> count;
  AssertionHandler catchAssertionHandler;
  lcg64_shift R;
  vector<double,_std::allocator<double>_> local_108;
  vector<int,_std::allocator<int>_> local_f0;
  double local_d8;
  AssertionHandler local_c0;
  StringRef local_78;
  lcg64_shift local_68;
  StringRef local_50;
  SourceLineInfo local_40;
  
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  sVar2 = (d->P).N_;
  lVar3 = 8;
  uVar6 = 0;
  do {
    uVar5 = uVar6;
    lVar11 = lVar3;
    iVar7 = (int)sVar2;
    if ((long)(iVar7 + -1) < (long)uVar5) break;
    lVar3 = (long)iVar7;
    local_c0.m_assertionInfo.macroName.m_start = (char *)0x0;
    if ((long)uVar5 < lVar3) {
      pdVar4 = (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_c0.m_assertionInfo.macroName.m_start =
           (char *)(pdVar4[(d->P).offset_ + uVar5] / *pdVar4);
    }
    if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_108,
                 (iterator)
                 local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_c0);
      sVar2 = (d->P).N_;
      lVar3 = (long)(int)sVar2;
    }
    else {
      *local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_c0.m_assertionInfo.macroName.m_start;
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar7 = (int)sVar2;
    if (lVar3 <= (long)uVar5) break;
    pdVar8 = (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = pdVar8 + (d->P).offset_;
    dVar13 = 0.0;
    if (pdVar4 != pdVar4 + uVar5 + 1) {
      lVar3 = 0;
      do {
        dVar13 = dVar13 + *(double *)((long)pdVar4 + lVar3);
        lVar3 = lVar3 + 8;
      } while (lVar11 != lVar3);
    }
    lVar3 = lVar11 + 8;
    uVar6 = uVar5 + 1;
  } while (dVar13 / *pdVar8 <= 0.99);
  if ((int)uVar5 < iVar7 + -1) {
    dVar13 = 1.0;
    if ((int)uVar5 < iVar7) {
      pdVar8 = (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = pdVar8 + (d->P).offset_;
      dVar13 = 0.0;
      if (pdVar4 != pdVar4 + (uVar5 & 0xffffffff) + 1) {
        do {
          dVar13 = dVar13 + *pdVar4;
          pdVar4 = pdVar4 + 1;
          lVar11 = lVar11 + -8;
        } while (lVar11 != 0);
      }
      dVar13 = dVar13 / *pdVar8;
    }
    local_c0.m_assertionInfo.macroName.m_start = (char *)(1.0 - dVar13);
    if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_108,
                 (iterator)
                 local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_c0);
    }
    else {
      *local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_c0.m_assertionInfo.macroName.m_start;
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar12 = (int)((ulong)((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  local_c0.m_assertionInfo.macroName.m_start =
       (char *)((ulong)local_c0.m_assertionInfo.macroName.m_start & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_f0,(long)iVar12,(value_type_conflict *)&local_c0,(allocator_type *)&local_68);
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64_shift::lcg64_shift(&local_68,100,P);
  iVar12 = iVar12 + -1;
  iVar7 = 10000;
  do {
    iVar1 = trng::discrete_dist::operator()(d,&local_68);
    if (iVar12 < iVar1) {
      iVar1 = iVar12;
    }
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [iVar1] = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar1] + 1;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  uVar6 = (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  while (0x10 < uVar6) {
    piVar9 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    piVar10 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    if (piVar9 != local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
        local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      iVar7 = *local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (*piVar9 < iVar7) {
          piVar10 = piVar9;
          iVar7 = *piVar9;
        }
        piVar9 = piVar9 + 1;
      } while (piVar9 != local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    if (8 < *piVar10) break;
    lVar3 = (long)piVar10 -
            (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    pdVar4 = (double *)
             ((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar3 * 2);
    pdVar8 = pdVar4 + 1;
    local_d8 = *pdVar4;
    iVar7 = *piVar10;
    if (pdVar8 != local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      memmove((void *)((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar3 * 2),pdVar8,
              (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar8);
    }
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
    piVar9 = (int *)((long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar3 + 4);
    if (piVar9 != local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      memmove((void *)((long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar3),piVar9,
              (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar9);
    }
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + -1;
    piVar9 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    piVar10 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    if (piVar9 != local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
        local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      iVar12 = *local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (*piVar9 < iVar12) {
          piVar10 = piVar9;
          iVar12 = *piVar9;
        }
        piVar9 = piVar9 + 1;
      } while (piVar9 != local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    *(double *)
     ((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start +
     ((long)piVar10 -
     (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start) * 2) =
         local_d8 +
         *(double *)
          ((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start +
          ((long)piVar10 -
          (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) * 2);
    *piVar10 = *piVar10 + iVar7;
    uVar6 = (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_d8 = chi_percentil(&local_108,&local_f0);
  local_78.m_start = "REQUIRE";
  local_78.m_size = 7;
  local_40.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_40.line = 0x11c;
  Catch::StringRef::StringRef(&local_50,"(0.01 < c2_p and c2_p < 0.99)");
  Catch::AssertionHandler::AssertionHandler(&local_c0,&local_78,&local_40,local_50,Normal);
  local_78.m_start =
       (char *)(CONCAT71(local_78.m_start._1_7_,-(local_d8 < 0.99) & -(0.01 < local_d8)) &
               0xffffffffffffff01);
  Catch::AssertionHandler::handleExpr<bool>(&local_c0,(ExprLhs<bool> *)&local_78);
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void discrete_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  std::vector<double> p;
  {
    int i{d.min()};
    while (i <= d.max()) {
      p.push_back(d.pdf(i));
      double P{d.cdf(i)};
      if (P > 0.99)
        break;
      ++i;
    }
    if (i < d.max())
      p.push_back(1.0 - d.cdf(i));
  }
  const int bins{static_cast<int>(p.size())};
  const int N{10000};
  std::vector<int> count(bins, 0);
  trng::lcg64_shift R(100ull);
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R) - d.min()};
    int bin{std::min(x, bins - 1)};
    ++count[bin];
  }
  // merge bins with very small count numbers
  while (p.size() > 2) {
    auto min{std::min_element(count.begin(), count.end())};
    if (*min > 8)
      break;
    auto pos{min - count.begin()};
    const double p_old{p[pos]};
    const int count_old{count[pos]};
    p.erase(p.begin() + pos);
    count.erase(count.begin() + pos);
    min = std::min_element(count.begin(), count.end());
    pos = min - count.begin();
    p[pos] += p_old;
    count[pos] += count_old;
  }
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}